

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

bool cmDyndepCollation::WriteDyndepMetadata
               (string *lang,vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *objects,
               cmCxxModuleExportInfo *export_info,cmDyndepMetadataCallbacks *cb)

{
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *this;
  bool bVar1;
  __uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
  args;
  reference b;
  pointer ppVar2;
  reference pcVar3;
  mapped_type *this_00;
  CxxModuleBmiInstall *pCVar4;
  ostream *poVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference ppVar8;
  type pcVar9;
  reference b_00;
  size_type sVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var12;
  string_view sVar13;
  string local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *req;
  iterator __end2_2;
  iterator __begin2_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pub_reqs;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1_3;
  pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
  *exp_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  *__range1_2;
  string_view local_720;
  string local_710;
  string_view local_6f0;
  string local_6e0;
  string_view local_6c0;
  string local_6b0;
  CxxModuleBmiInstall *local_690;
  CxxModuleBmiInstall *bmi_install;
  char *local_680;
  string local_678;
  string local_658 [8];
  string bmi_path;
  string local_628;
  string local_608;
  string_view local_5e8;
  string local_5d8;
  string_view local_5b8;
  string local_5a8;
  char local_581;
  string local_580;
  undefined1 local_560 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dest_1;
  string iface_source;
  pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
  *exp_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  *__range3_1;
  string local_4e8;
  string local_4c8;
  string_view local_4a8;
  string local_498;
  string local_478;
  undefined1 local_458 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> m;
  string build_bmi_path;
  string install_bmi_path;
  string local_3e8;
  undefined1 local_3c8 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> dest;
  string bmi_destination;
  bool bmi_dest_is_abs;
  cmSourceReqInfo *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range2_1;
  cmSourceReqInfo *r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range2;
  mapped_type *reqs;
  cmSourceReqInfo *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range3;
  const_reference local_2d0;
  value_type *provides_1;
  char *local_2c0;
  value_type *local_2b8;
  char *local_2b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2a8;
  string local_298;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_258;
  CxxModuleFileSet *local_248;
  CxxModuleFileSet *file_set;
  string local_238;
  const_reference local_218;
  value_type *provides;
  byte local_201;
  const_iterator cStack_200;
  bool has_provides;
  const_iterator fileset_info_itr;
  string output_path;
  cmScanDepInfo *object;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  public_source_requires;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  private_modules;
  anon_class_8_1_16492709 install_destination;
  undefined1 local_148 [7];
  anon_class_1_0_00000001 cmEscape;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> local_140;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> bmi_install_script;
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  string property_file_path;
  char local_ea [2];
  undefined1 local_e8 [8];
  string export_dir;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> properties;
  CxxModuleExport *exp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CxxModuleExport,_std::allocator<CxxModuleExport>_> *__range1;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  exports;
  string config_upper;
  bool result;
  cmDyndepMetadataCallbacks *cb_local;
  cmCxxModuleExportInfo *export_info_local;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *objects_local;
  string *lang_local;
  
  _Var12 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
  bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX",3);
  bVar1 = std::operator!=(_Var12,bVar11);
  if (bVar1) {
    lang_local._7_1_ = true;
  }
  else {
    config_upper.field_2._M_local_buf[0xf] = '\x01';
    cmsys::SystemTools::UpperCase
              ((string *)
               &exports.
                super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&export_info->Config);
    std::
    vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ::vector((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
              *)&__range1);
    __end1 = std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::begin
                       (&export_info->Exports);
    exp = (CxxModuleExport *)
          std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::end(&export_info->Exports)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_CxxModuleExport_*,_std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>_>
                                       *)&exp), bVar1) {
      args.super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
           (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)
           __gnu_cxx::
           __normal_iterator<const_CxxModuleExport_*,_std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>_>
           ::operator*(&__end1);
      std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
      unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
                ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
                 (export_dir.field_2._M_local_buf + 8));
      local_ea[1] = 0x2f;
      local_ea[0] = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char>
                ((string *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)args.
                        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl + 0x40),
                 local_ea + 1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)args.
                        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl + 0x60),
                 local_ea);
      local_130[0xf] = 0x2d;
      cmStrCat<std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[7]>
                ((string *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 (char (*) [8])0x12754d9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 args.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,local_130 + 0xf
                 ,&export_info->Config,(char (*) [7])0x1251d9b);
      std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
      this = (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
             ((long)&export_dir.field_2 + 8);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
                (this,(unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       *)local_130);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
      ~unique_ptr((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                  local_130);
      pcVar9 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(this);
      poVar5 = std::operator<<((ostream *)pcVar9,"set_property(TARGET \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((long)args.
                                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>.
                                             _M_head_impl + 0x80));
      poVar5 = std::operator<<(poVar5,(string *)
                                      args.
                                      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                      .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>.
                                      _M_head_impl);
      poVar5 = std::operator<<(poVar5,"\"\n");
      poVar5 = std::operator<<(poVar5,"  PROPERTY IMPORTED_CXX_MODULES_");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &exports.
                                       super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar5,'\n');
      bmi_install_script._M_t.
      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t
      .super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
            )(__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
              )args.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::
      vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
      ::
      emplace_back<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>
                ((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
                  *)&__range1,
                 (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                 ((long)&export_dir.field_2 + 8),(CxxModuleExport **)&bmi_install_script);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)local_e8);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
      ~unique_ptr((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                  ((long)&export_dir.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<const_CxxModuleExport_*,_std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
    unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
              ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
               &local_140);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&export_info->BmiInstallation);
    if (bVar1) {
      std::optional<CxxModuleBmiInstall>::operator->(&export_info->BmiInstallation);
      std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
                (&local_140,
                 (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                 local_148);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
      ~unique_ptr((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                  local_148);
    }
    private_modules._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (long)&install_destination.cmEscape + 7;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&public_source_requires._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)&__range1_1);
    __end1_1 = std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::begin(objects);
    object = (cmScanDepInfo *)
             std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::end(objects);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<const_cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
                          *)&object);
      if (!bVar1) break;
      b = __gnu_cxx::
          __normal_iterator<const_cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
          ::operator*(&__end1_1);
      std::__cxx11::string::string((string *)&fileset_info_itr,(string *)b);
      cStack_200 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                   ::find(&export_info->ObjectToFileSet,(key_type *)&fileset_info_itr);
      bVar1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::empty(&b->Provides);
      local_201 = (bVar1 ^ 0xffU) & 1;
      provides = (value_type *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                 ::end(&export_info->ObjectToFileSet);
      bVar1 = std::operator==(&stack0xfffffffffffffe00,(_Self *)&provides);
      if (bVar1) {
        if ((local_201 & 1) != 0) {
          local_218 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::operator[]
                                (&b->Provides,0);
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string_const&,char_const(&)[67]>
                    (&local_238,(char (*) [8])0x127326b,&b->PrimaryOutput,
                     (char (*) [16])" provides the `",&local_218->LogicalName,
                     (char (*) [67])
                     "` module but it is not found in a `FILE_SET` of type `CXX_MODULES`");
          cmSystemTools::Error(&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          config_upper.field_2._M_local_buf[0xf] = '\0';
        }
        file_set._4_4_ = 5;
      }
      else {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>
                 ::operator->(&stack0xfffffffffffffe00);
        local_248 = &ppVar2->second;
        _Var12 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&(ppVar2->second).Type);
        local_258 = _Var12;
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                 ::cm::operator____s("CXX_MODULES",0xb);
        local_278 = bVar11;
        local_268 = bVar11;
        bVar1 = std::operator==(local_258,bVar11);
        if (bVar1) {
          if ((local_201 & 1) != 0) goto LAB_009ee46f;
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[84]>
                    (&local_298,(char (*) [8])0x127326b,&b->PrimaryOutput,
                     (char (*) [84])
                     " is of type `CXX_MODULES` but does not provide a module interface unit or partition"
                    );
          cmSystemTools::Error(&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          config_upper.field_2._M_local_buf[0xf] = '\0';
          file_set._4_4_ = 5;
        }
        else {
          _Var12 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&local_248->Type);
          local_2a8 = _Var12;
          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                   ::cm::operator____s("CXX_MODULE_HEADERS",0x12);
          local_2c0 = bVar11._M_str;
          provides_1 = (value_type *)bVar11._M_len;
          local_2b8 = provides_1;
          local_2b0 = local_2c0;
          bVar1 = std::operator==(local_2a8,bVar11);
          if (bVar1) {
LAB_009ee46f:
            bVar1 = cmFileSetVisibilityIsForInterface(local_248->Visibility);
            if (bVar1) {
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&__range1_1,&local_248->SourcePath);
              __end2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                                 (&b->Requires);
              r = (cmSourceReqInfo *)
                  std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(&b->Requires);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end2,(__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                            *)&r);
                if (!bVar1) break;
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                         ::operator*(&__end2);
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(this_00,&pcVar3->LogicalName);
                __gnu_cxx::
                __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                ::operator++(&__end2);
              }
              __end2_1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                                   (&b->Provides);
              p_1 = (cmSourceReqInfo *)
                    std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end
                              (&b->Provides);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end2_1,
                                   (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                    *)&p_1);
                if (!bVar1) break;
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                         ::operator*(&__end2_1);
                bmi_destination.field_2._M_local_buf[0xf] = '\0';
                std::__cxx11::string::string((string *)(dest.second.field_2._M_local_buf + 8));
                bVar1 = std::optional::operator_cast_to_bool
                                  ((optional *)&export_info->BmiInstallation);
                if (bVar1) {
                  pCVar4 = std::optional<CxxModuleBmiInstall>::operator->
                                     (&export_info->BmiInstallation);
                  WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                  ::$_0::operator()::string_const___const
                            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3c8,
                             &private_modules._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &pCVar4->Destination);
                  bmi_destination.field_2._M_local_buf[0xf] = local_3c8[0] & 1;
                  install_bmi_path.field_2._M_local_buf[0xf] = '/';
                  cmStrCat<std::__cxx11::string&,char>
                            (&local_3e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &dest,install_bmi_path.field_2._M_local_buf + 0xf);
                  std::__cxx11::string::operator=
                            ((string *)(dest.second.field_2._M_local_buf + 8),(string *)&local_3e8);
                  std::__cxx11::string::~string((string *)&local_3e8);
                  std::
                  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_3c8);
                }
                std::__cxx11::string::string((string *)(build_bmi_path.field_2._M_local_buf + 8));
                std::__cxx11::string::string
                          ((string *)
                           &m.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
                std::
                function<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_458,&cb->ModuleFile,&pcVar3->LogicalName);
                bVar1 = std::optional::operator_cast_to_bool((optional *)local_458);
                if (bVar1) {
                  pbVar7 = std::
                           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_458);
                  cmsys::SystemTools::GetFilenameName(&local_4c8,pbVar7);
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)&local_4c8);
                  local_4a8 = sVar13;
                  WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                  ::$_1::operator()::char_traits<char>_>__const
                            (&local_498,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                  cmStrCat<std::__cxx11::string&,std::__cxx11::string>
                            (&local_478,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&dest.second.field_2 + 8),&local_498);
                  std::__cxx11::string::operator=
                            ((string *)(build_bmi_path.field_2._M_local_buf + 8),
                             (string *)&local_478);
                  std::__cxx11::string::~string((string *)&local_478);
                  std::__cxx11::string::~string((string *)&local_498);
                  std::__cxx11::string::~string((string *)&local_4c8);
                  pbVar7 = std::
                           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_458);
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)pbVar7);
                  WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                  ::$_1::operator()::char_traits<char>_>__const
                            (&local_4e8,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                  std::__cxx11::string::operator=
                            ((string *)
                             &m.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged,(string *)&local_4e8);
                  std::__cxx11::string::~string((string *)&local_4e8);
                }
                __end3_1 = std::
                           vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                           ::begin((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                                    *)&__range1);
                exp_1 = (pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
                         *)std::
                           vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                           ::end((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                                  *)&__range1);
                while( true ) {
                  bVar1 = __gnu_cxx::operator!=
                                    (&__end3_1,
                                     (__normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
                                      *)&exp_1);
                  if (!bVar1) break;
                  ppVar8 = __gnu_cxx::
                           __normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
                           ::operator*(&__end3_1);
                  std::__cxx11::string::string((string *)(dest_1.second.field_2._M_local_buf + 8));
                  if ((ppVar8->second->Install & 1U) == 0) {
LAB_009eebe6:
                    sVar13 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)&local_248->SourcePath);
                    bmi_path.field_2._8_8_ = sVar13._M_len;
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::char_traits<char>_>__const
                              (&local_628,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                    std::__cxx11::string::operator=
                              ((string *)(dest_1.second.field_2._M_local_buf + 8),
                               (string *)&local_628);
                    std::__cxx11::string::~string((string *)&local_628);
                  }
                  else {
                    bVar1 = std::optional::operator_cast_to_bool
                                      ((optional *)&local_248->Destination);
                    if (!bVar1) goto LAB_009eebe6;
                    pbVar7 = std::
                             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_248->Destination);
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_0::operator()::string_const___const
                              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_560,
                               &private_modules._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               pbVar7);
                    local_581 = '/';
                    sVar13 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)&local_248->RelativeDirectory);
                    local_5b8 = sVar13;
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::char_traits<char>_>__const
                              (&local_5a8,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                    cmsys::SystemTools::GetFilenameName(&local_608,&local_248->SourcePath);
                    sVar13 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)&local_608);
                    local_5e8 = sVar13;
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::char_traits<char>_>__const
                              (&local_5d8,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string,std::__cxx11::string>
                              (&local_580,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &dest_1,&local_581,&local_5a8,&local_5d8);
                    std::__cxx11::string::operator=
                              ((string *)(dest_1.second.field_2._M_local_buf + 8),
                               (string *)&local_580);
                    std::__cxx11::string::~string((string *)&local_580);
                    std::__cxx11::string::~string((string *)&local_5d8);
                    std::__cxx11::string::~string((string *)&local_608);
                    std::__cxx11::string::~string((string *)&local_5a8);
                    std::
                    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_560);
                  }
                  std::__cxx11::string::string(local_658);
                  if ((ppVar8->second->Install & 1U) == 0) {
LAB_009eeca7:
                    if ((ppVar8->second->Install & 1U) == 0) {
                      std::__cxx11::string::operator=
                                (local_658,
                                 (string *)
                                 &m.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_engaged);
                    }
                  }
                  else {
                    bVar1 = std::optional::operator_cast_to_bool
                                      ((optional *)&export_info->BmiInstallation);
                    if (!bVar1) goto LAB_009eeca7;
                    std::__cxx11::string::operator=
                              (local_658,(string *)(build_bmi_path.field_2._M_local_buf + 8));
                  }
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&ppVar8->first);
                    poVar5 = std::operator<<((ostream *)pcVar9,"    \"");
                    sVar13 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)pcVar3);
                    local_680 = sVar13._M_str;
                    bmi_install = (CxxModuleBmiInstall *)sVar13._M_len;
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::char_traits<char>_>__const
                              (&local_678,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                    poVar5 = std::operator<<(poVar5,(string *)&local_678);
                    poVar5 = std::operator<<(poVar5,'=');
                    std::operator<<(poVar5,(string *)(dest_1.second.field_2._M_local_buf + 8));
                    std::__cxx11::string::~string((string *)&local_678);
                    uVar6 = std::__cxx11::string::empty();
                    if ((uVar6 & 1) == 0) {
                      pcVar9 = std::
                               unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ::operator*(&ppVar8->first);
                      poVar5 = std::operator<<((ostream *)pcVar9,',');
                      std::operator<<(poVar5,local_658);
                    }
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&ppVar8->first);
                    std::operator<<((ostream *)pcVar9,"\"\n");
                    file_set._4_4_ = 0;
                  }
                  else {
                    file_set._4_4_ = 0xd;
                  }
                  std::__cxx11::string::~string(local_658);
                  std::__cxx11::string::~string((string *)(dest_1.second.field_2._M_local_buf + 8));
                  __gnu_cxx::
                  __normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
                  ::operator++(&__end3_1);
                }
                bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_140);
                if (bVar1) {
                  local_690 = std::optional<CxxModuleBmiInstall>::operator*
                                        (&export_info->BmiInstallation);
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  poVar5 = std::operator<<((ostream *)pcVar9,
                                           "if (CMAKE_INSTALL_COMPONENT STREQUAL \"");
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)local_690);
                  local_6c0 = sVar13;
                  WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                  ::$_1::operator()::char_traits<char>_>__const
                            (&local_6b0,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                  poVar5 = std::operator<<(poVar5,(string *)&local_6b0);
                  std::operator<<(poVar5,'\"');
                  std::__cxx11::string::~string((string *)&local_6b0);
                  if ((local_690->ExcludeFromAll & 1U) == 0) {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    std::operator<<((ostream *)pcVar9," OR NOT CMAKE_INSTALL_COMPONENT");
                  }
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  std::operator<<((ostream *)pcVar9,")\n");
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  std::operator<<((ostream *)pcVar9,"  file(INSTALL\n    DESTINATION \"");
                  if (bmi_destination.field_2._M_local_buf[0xf] == '\0') {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    std::operator<<((ostream *)pcVar9,"${CMAKE_INSTALL_PREFIX}/");
                  }
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)&local_690->Destination);
                  local_6f0 = sVar13;
                  WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                  ::$_1::operator()::char_traits<char>_>__const
                            (&local_6e0,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                  poVar5 = std::operator<<((ostream *)pcVar9,(string *)&local_6e0);
                  std::operator<<(poVar5,"\"\n    TYPE FILE\n");
                  std::__cxx11::string::~string((string *)&local_6e0);
                  if ((local_690->Optional & 1U) != 0) {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    std::operator<<((ostream *)pcVar9,"    OPTIONAL\n");
                  }
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    poVar5 = std::operator<<((ostream *)pcVar9,"    ");
                    poVar5 = std::operator<<(poVar5,(string *)&local_690->MessageLevel);
                    std::operator<<(poVar5,"\n");
                  }
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    poVar5 = std::operator<<((ostream *)pcVar9,"    PERMISSIONS");
                    poVar5 = std::operator<<(poVar5,(string *)&local_690->Permissions);
                    std::operator<<(poVar5,"\n");
                  }
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  poVar5 = std::operator<<((ostream *)pcVar9,"    FILES \"");
                  pbVar7 = std::
                           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_458);
                  poVar5 = std::operator<<(poVar5,(string *)pbVar7);
                  std::operator<<(poVar5,"\")\n");
                  if (bmi_destination.field_2._M_local_buf[0xf] != '\0') {
                    pcVar9 = std::
                             unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ::operator*(&local_140);
                    poVar5 = std::operator<<((ostream *)pcVar9,
                                             "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n    \""
                                            );
                    pbVar7 = std::
                             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_458);
                    cmsys::SystemTools::GetFilenameName((string *)&__range1_2,pbVar7);
                    sVar13 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)&__range1_2);
                    local_720 = sVar13;
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::char_traits<char>_>__const
                              (&local_710,(void *)((long)&install_destination.cmEscape + 7),sVar13);
                    poVar5 = std::operator<<(poVar5,(string *)&local_710);
                    std::operator<<(poVar5,
                                    "\")\n  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(WARNING\n      \"ABSOLUTE path INSTALL DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(FATAL_ERROR\n      \"ABSOLUTE path INSTALL DESTINATION forbidden (by caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n"
                                   );
                    std::__cxx11::string::~string((string *)&local_710);
                    std::__cxx11::string::~string((string *)&__range1_2);
                  }
                  pcVar9 = std::
                           unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ::operator*(&local_140);
                  std::operator<<((ostream *)pcVar9,"endif ()\n");
                }
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_458);
                std::__cxx11::string::~string
                          ((string *)
                           &m.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
                std::__cxx11::string::~string((string *)(build_bmi_path.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(dest.second.field_2._M_local_buf + 8));
                __gnu_cxx::
                __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                ::operator++(&__end2_1);
              }
              file_set._4_4_ = 0;
            }
            else {
              __end3 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                                 (&b->Provides);
              p = (cmSourceReqInfo *)
                  std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(&b->Provides);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end3,(__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                            *)&p);
                if (!bVar1) break;
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                         ::operator*(&__end3);
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&public_source_requires._M_t._M_impl.super__Rb_tree_header._M_node_count
                         ,&pcVar3->LogicalName);
                __gnu_cxx::
                __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                ::operator++(&__end3);
              }
              file_set._4_4_ = 5;
            }
          }
          else {
            if ((local_201 & 1) != 0) {
              local_2d0 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::operator[]
                                    (&b->Provides,0);
              cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string_const&,char_const(&)[43]>
                        ((string *)&__range3,(char (*) [8])"Source ",&local_248->SourcePath,
                         (char (*) [16])" provides the `",&local_2d0->LogicalName,
                         (char (*) [30])"` C++ module but is of type `",&local_248->Type,
                         (char (*) [43])"` module but must be of type `CXX_MODULES`");
              cmSystemTools::Error((string *)&__range3);
              std::__cxx11::string::~string((string *)&__range3);
              config_upper.field_2._M_local_buf[0xf] = '\0';
            }
            file_set._4_4_ = 5;
          }
        }
      }
      std::__cxx11::string::~string((string *)&fileset_info_itr);
      __gnu_cxx::
      __normal_iterator<const_cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
               ::begin((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                        *)&__range1);
    exp_2 = (pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
             *)std::
               vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
               ::end((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                      *)&__range1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_2,
                         (__normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
                          *)&exp_2);
      if (!bVar1) break;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
               ::operator*(&__end1_2);
      pcVar9 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&ppVar8->first);
      std::operator<<((ostream *)pcVar9,")\n");
      __gnu_cxx::
      __normal_iterator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_*,_std::vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>_>
      ::operator++(&__end1_2);
    }
    __end1_3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__range1_1);
    pub_reqs = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&__range1_1);
    while( true ) {
      bVar1 = std::operator!=(&__end1_3,(_Self *)&pub_reqs);
      if (!bVar1) break;
      b_00 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end1_3);
      __end2_2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&b_00->second);
      req = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&b_00->second);
      while( true ) {
        bVar1 = std::operator!=(&__end2_2,(_Self *)&req);
        if (!bVar1) break;
        local_7a0 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2_2);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&public_source_requires._M_t._M_impl.super__Rb_tree_header._M_node_count
                         ,local_7a0);
        if (sVar10 != 0) {
          cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[17],std::__cxx11::string_const&,char_const(&)[51]>
                    (&local_7c0,(char (*) [27])"Public C++ module source `",&b_00->first,
                     (char (*) [17])"` requires the `",local_7a0,
                     (char (*) [51])"` C++ module which is provided by a private source");
          cmSystemTools::Error(&local_7c0);
          std::__cxx11::string::~string((string *)&local_7c0);
          config_upper.field_2._M_local_buf[0xf] = '\0';
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2_2);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_3);
    }
    lang_local._7_1_ = (bool)config_upper.field_2._M_local_buf[0xf];
    file_set._4_4_ = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)&__range1_1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&public_source_requires._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              (&local_140);
    std::
    vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ::~vector((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
               *)&__range1);
    std::__cxx11::string::~string
              ((string *)
               &exports.
                super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return lang_local._7_1_;
}

Assistant:

bool cmDyndepCollation::WriteDyndepMetadata(
  std::string const& lang, std::vector<cmScanDepInfo> const& objects,
  cmCxxModuleExportInfo const& export_info,
  cmDyndepMetadataCallbacks const& cb)
{
  // Only C++ supports any of the file-set or BMI installation considered
  // below.
  if (lang != "CXX"_s) {
    return true;
  }

  bool result = true;

  // Prepare the export information blocks.
  std::string const config_upper =
    cmSystemTools::UpperCase(export_info.Config);
  std::vector<
    std::pair<std::unique_ptr<cmGeneratedFileStream>, CxxModuleExport const*>>
    exports;
  for (auto const& exp : export_info.Exports) {
    std::unique_ptr<cmGeneratedFileStream> properties;

    std::string const export_dir =
      cmStrCat(exp.Prefix, '/', exp.CxxModuleInfoDir, '/');
    std::string const property_file_path = cmStrCat(
      export_dir, "target-", exp.Name, '-', export_info.Config, ".cmake");
    properties = cm::make_unique<cmGeneratedFileStream>(property_file_path);

    // Set up the preamble.
    *properties << "set_property(TARGET \"" << exp.Namespace << exp.Name
                << "\"\n"
                << "  PROPERTY IMPORTED_CXX_MODULES_" << config_upper << '\n';

    exports.emplace_back(std::move(properties), &exp);
  }

  std::unique_ptr<cmGeneratedFileStream> bmi_install_script;
  if (export_info.BmiInstallation) {
    bmi_install_script = cm::make_unique<cmGeneratedFileStream>(
      export_info.BmiInstallation->ScriptLocation);
  }

  auto cmEscape = [](cm::string_view str) {
    return cmOutputConverter::EscapeForCMake(
      str, cmOutputConverter::WrapQuotes::NoWrap);
  };
  auto install_destination =
    [&cmEscape](std::string const& dest) -> std::pair<bool, std::string> {
    if (cmSystemTools::FileIsFullPath(dest)) {
      return std::make_pair(true, cmEscape(dest));
    }
    return std::make_pair(false,
                          cmStrCat("${_IMPORT_PREFIX}/", cmEscape(dest)));
  };

  // public/private requirement tracking.
  std::set<std::string> private_modules;
  std::map<std::string, std::set<std::string>> public_source_requires;

  for (cmScanDepInfo const& object : objects) {
    // Convert to forward slashes.
    auto output_path = object.PrimaryOutput;
#ifdef _WIN32
    cmSystemTools::ConvertToUnixSlashes(output_path);
#endif
    // Find the fileset for this object.
    auto fileset_info_itr = export_info.ObjectToFileSet.find(output_path);
    bool const has_provides = !object.Provides.empty();
    if (fileset_info_itr == export_info.ObjectToFileSet.end()) {
      // If it provides anything, it should have type `CXX_MODULES`
      // and be present.
      if (has_provides) {
        // Take the first module provided to provide context.
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput, " provides the `",
                   provides.LogicalName,
                   "` module but it is not found in a `FILE_SET` of type "
                   "`CXX_MODULES`"));
        result = false;
      }

      // This object file does not provide anything, so nothing more needs to
      // be done.
      continue;
    }

    auto const& file_set = fileset_info_itr->second;

    // Verify the fileset type for the object.
    if (file_set.Type == "CXX_MODULES"_s) {
      if (!has_provides) {
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput,
                   " is of type `CXX_MODULES` but does not provide a module "
                   "interface unit or partition"));
        result = false;
        continue;
      }
    } else if (file_set.Type == "CXX_MODULE_HEADERS"_s) {
      // TODO.
    } else {
      if (has_provides) {
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(cmStrCat(
          "Source ", file_set.SourcePath, " provides the `",
          provides.LogicalName, "` C++ module but is of type `", file_set.Type,
          "` module but must be of type `CXX_MODULES`"));
        result = false;
      }

      // Not a C++ module; ignore.
      continue;
    }

    if (!cmFileSetVisibilityIsForInterface(file_set.Visibility)) {
      // Nothing needs to be conveyed about non-`PUBLIC` modules.
      for (auto const& p : object.Provides) {
        private_modules.insert(p.LogicalName);
      }
      continue;
    }

    // The module is public. Record what it directly requires.
    {
      auto& reqs = public_source_requires[file_set.SourcePath];
      for (auto const& r : object.Requires) {
        reqs.insert(r.LogicalName);
      }
    }

    // Write out properties and install rules for any exports.
    for (auto const& p : object.Provides) {
      bool bmi_dest_is_abs = false;
      std::string bmi_destination;
      if (export_info.BmiInstallation) {
        auto dest =
          install_destination(export_info.BmiInstallation->Destination);
        bmi_dest_is_abs = dest.first;
        bmi_destination = cmStrCat(dest.second, '/');
      }

      std::string install_bmi_path;
      std::string build_bmi_path;
      auto m = cb.ModuleFile(p.LogicalName);
      if (m) {
        install_bmi_path = cmStrCat(
          bmi_destination, cmEscape(cmSystemTools::GetFilenameName(*m)));
        build_bmi_path = cmEscape(*m);
      }

      for (auto const& exp : exports) {
        std::string iface_source;
        if (exp.second->Install && file_set.Destination) {
          auto dest = install_destination(*file_set.Destination);
          iface_source = cmStrCat(
            dest.second, '/', cmEscape(file_set.RelativeDirectory),
            cmEscape(cmSystemTools::GetFilenameName(file_set.SourcePath)));
        } else {
          iface_source = cmEscape(file_set.SourcePath);
        }

        std::string bmi_path;
        if (exp.second->Install && export_info.BmiInstallation) {
          bmi_path = install_bmi_path;
        } else if (!exp.second->Install) {
          bmi_path = build_bmi_path;
        }

        if (iface_source.empty()) {
          // No destination for the C++ module source; ignore this property
          // value.
          continue;
        }

        *exp.first << "    \"" << cmEscape(p.LogicalName) << '='
                   << iface_source;
        if (!bmi_path.empty()) {
          *exp.first << ',' << bmi_path;
        }
        *exp.first << "\"\n";
      }

      if (bmi_install_script) {
        auto const& bmi_install = *export_info.BmiInstallation;

        *bmi_install_script << "if (CMAKE_INSTALL_COMPONENT STREQUAL \""
                            << cmEscape(bmi_install.Component) << '\"';
        if (!bmi_install.ExcludeFromAll) {
          *bmi_install_script << " OR NOT CMAKE_INSTALL_COMPONENT";
        }
        *bmi_install_script << ")\n";
        *bmi_install_script << "  file(INSTALL\n"
                               "    DESTINATION \"";
        if (!bmi_dest_is_abs) {
          *bmi_install_script << "${CMAKE_INSTALL_PREFIX}/";
        }
        *bmi_install_script << cmEscape(bmi_install.Destination)
                            << "\"\n"
                               "    TYPE FILE\n";
        if (bmi_install.Optional) {
          *bmi_install_script << "    OPTIONAL\n";
        }
        if (!bmi_install.MessageLevel.empty()) {
          *bmi_install_script << "    " << bmi_install.MessageLevel << "\n";
        }
        if (!bmi_install.Permissions.empty()) {
          *bmi_install_script << "    PERMISSIONS" << bmi_install.Permissions
                              << "\n";
        }
        *bmi_install_script << "    FILES \"" << *m << "\")\n";
        if (bmi_dest_is_abs) {
          *bmi_install_script
            << "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n"
               "    \""
            << cmEscape(cmSystemTools::GetFilenameName(*m))
            << "\")\n"
               "  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(WARNING\n"
               "      \"ABSOLUTE path INSTALL DESTINATION : "
               "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n"
               "  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(FATAL_ERROR\n"
               "      \"ABSOLUTE path INSTALL DESTINATION forbidden (by "
               "caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n";
        }
        *bmi_install_script << "endif ()\n";
      }
    }
  }

  // Add trailing parenthesis for the `set_property` call.
  for (auto const& exp : exports) {
    *exp.first << ")\n";
  }

  // Check that public sources only require public modules.
  for (auto const& pub_reqs : public_source_requires) {
    for (auto const& req : pub_reqs.second) {
      if (private_modules.count(req)) {
        cmSystemTools::Error(cmStrCat(
          "Public C++ module source `", pub_reqs.first, "` requires the `",
          req, "` C++ module which is provided by a private source"));
        result = false;
      }
    }
  }

  return result;
}